

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O0

bool __thiscall OpenMD::Globals::addComponent(Globals *this,Component *comp)

{
  value_type *in_RDI;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool Globals::addComponent(Component* comp) {
    components_.push_back(comp);
    return true;
  }